

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtraction.h
# Opt level: O0

void __thiscall
Subtraction_PlusPlus_Test::~Subtraction_PlusPlus_Test(Subtraction_PlusPlus_Test *this)

{
  Subtraction_PlusPlus_Test *this_local;
  
  ~Subtraction_PlusPlus_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Subtraction, PlusPlus)
{
    BigNumber num_1("1234");
    EXPECT_EQ("1234", num_1--.toString());
    EXPECT_EQ("1233", num_1.toString());
    EXPECT_EQ("1233", num_1--.toString());
    EXPECT_EQ("1231", (--num_1).toString());
    EXPECT_EQ("1230", (--num_1).toString());
    EXPECT_EQ("1230", num_1.toString());
}